

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unistr.cpp
# Opt level: O2

UBool __thiscall
icu_63::UnicodeStringAppendable::appendCodePoint(UnicodeStringAppendable *this,UChar32 c)

{
  int32_t srcLength;
  undefined8 in_RAX;
  UnicodeString *pUVar1;
  undefined4 uStack_8;
  UChar buffer [2];
  
  uStack_8 = (undefined4)in_RAX;
  if ((uint)c < 0x10000) {
    buffer[1] = (UChar)((ulong)in_RAX >> 0x30);
    _uStack_8 = CONCAT24((short)c,uStack_8);
    srcLength = 1;
  }
  else {
    if (0x10ffff < (uint)c) {
      return '\0';
    }
    _uStack_8 = CONCAT24((short)((uint)c >> 10) + -0x2840,uStack_8);
    _uStack_8 = CONCAT26((short)c,_uStack_8) & 0x3ffffffffffffff | 0xdc00000000000000;
    srcLength = 2;
  }
  pUVar1 = UnicodeString::doAppend(this->str,buffer,0,srcLength);
  return (undefined1  [56])((undefined1  [56])pUVar1->fUnion & (undefined1  [56])0x11) ==
         (undefined1  [56])0x0;
}

Assistant:

UBool
UnicodeStringAppendable::appendCodePoint(UChar32 c) {
  UChar buffer[U16_MAX_LENGTH];
  int32_t cLength = 0;
  UBool isError = FALSE;
  U16_APPEND(buffer, cLength, U16_MAX_LENGTH, c, isError);
  return !isError && str.doAppend(buffer, 0, cLength).isWritable();
}